

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::undoUntil
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,HighsBasis *basis
          ,size_t numReductions)

{
  vector<int,_std::allocator<int>_> *index;
  vector<int,_std::allocator<int>_> *index_00;
  HighsDataStack *this_00;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *r;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *r_00;
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  pointer piVar4;
  pointer pcVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  LinearTransform reduction;
  
  piVar4 = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->reductionValues).position =
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (((long)(solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3 ==
       (long)piVar4 -
       (long)(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) &&
     ((long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2)) {
    index = &this->origColIndex;
    index_00 = &this->origRowIndex;
    bVar2 = solution->dual_valid;
    bVar3 = basis->valid;
    undoIterateBackwards<double>(this,&solution->col_value,index,this->origNumCol);
    undoIterateBackwards<double>(this,&solution->row_value,index_00,this->origNumRow);
    if (bVar2 == true) {
      undoIterateBackwards<double>(this,&solution->col_dual,index,this->origNumCol);
      undoIterateBackwards<double>(this,&solution->row_dual,index_00,this->origNumRow);
    }
    if (bVar3 != false) {
      undoIterateBackwards<HighsBasisStatus>(this,&basis->col_status,index,this->origNumCol);
      undoIterateBackwards<HighsBasisStatus>(this,&basis->row_status,index_00,this->origNumRow);
    }
    this_00 = &this->reductionValues;
    lVar8 = (long)(this->reductions).
                  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->reductions).
                  super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    r = &this->rowValues;
    r_00 = &this->colValues;
    uVar7 = lVar8 >> 4;
    for (; numReductions < uVar7; uVar7 = uVar7 - 1) {
      switch((&(this->reductions).
               super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].first)[lVar8]) {
      case kLinearTransform:
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x18;
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 8));
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x18));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        LinearTransform::undo(&reduction,options,solution);
        break;
      case kFreeColSubstitution:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x20;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x20));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 0x10));
        FreeColSubstitution::undo((FreeColSubstitution *)&reduction,options,r,r_00,solution,basis);
        break;
      case kDoubletonEquation:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        sVar6 = (this->reductionValues).position - 0x48;
        (this->reductionValues).position = sVar6;
        memcpy(&reduction,
               (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + sVar6,0x48);
        DoubletonEquation::undo((DoubletonEquation *)&reduction,options,r_00,solution,basis);
        break;
      case kEqualityRowAddition:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x10;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x10));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        EqualityRowAddition::undo((EqualityRowAddition *)&reduction,options,r,solution,basis);
        break;
      case kEqualityRowAdditions:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 4;
        reduction.scale =
             (double)CONCAT44(reduction.scale._4_4_,*(undefined4 *)(pcVar5 + (sVar6 - 4)));
        EqualityRowAdditions::undo((EqualityRowAdditions *)&reduction,options,r,r_00,solution,basis)
        ;
        break;
      case kSingletonRow:
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x18;
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 8));
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x18));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        SingletonRow::undo((SingletonRow *)&reduction,options,solution,basis);
        break;
      case kFixedCol:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x18;
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 8));
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x18));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        FixedCol::undo((FixedCol *)&reduction,options,r_00,solution,basis);
        break;
      case kRedundantRow:
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 4;
        reduction.scale =
             (double)CONCAT44(reduction.scale._4_4_,*(undefined4 *)(pcVar5 + (sVar6 - 4)));
        RedundantRow::undo((RedundantRow *)&reduction,options,solution,basis);
        break;
      case kForcingRow:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x10;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x10));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        ForcingRow::undo((ForcingRow *)&reduction,options,r,solution,basis);
        break;
      case kForcingColumn:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r_00);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x18;
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 8));
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x18));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        ForcingColumn::undo((ForcingColumn *)&reduction,options,r_00,solution,basis);
        break;
      case kForcingColumnRemovedRow:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x10;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x10));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        ForcingColumnRemovedRow::undo
                  ((ForcingColumnRemovedRow *)&reduction,options,r,solution,basis);
        break;
      case kDuplicateRow:
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x18;
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 8));
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x18));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        DuplicateRow::undo((DuplicateRow *)&reduction,options,solution,basis);
        break;
      case kDuplicateColumn:
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x38;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x38));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        reduction._16_8_ = *(undefined8 *)(pcVar5 + (sVar6 - 0x28));
        DuplicateColumn::undo((DuplicateColumn *)&reduction,options,solution,basis);
      case kSlackColSubstitution:
        HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>(this_00,r);
        pcVar5 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar6 = (this->reductionValues).position;
        (this->reductionValues).position = sVar6 - 0x10;
        pdVar1 = (double *)(pcVar5 + (sVar6 - 0x10));
        reduction.scale = *pdVar1;
        reduction.constant = pdVar1[1];
        SlackColSubstitution::undo((SlackColSubstitution *)&reduction,options,r,solution,basis);
      }
      lVar8 = lVar8 + -0x10;
    }
  }
  return;
}

Assistant:

void undoUntil(const HighsOptions& options, HighsSolution& solution,
                 HighsBasis& basis, size_t numReductions) {
    reductionValues.resetPosition();

    // Do these returns ever happen? How is it known that undo has not
    // been performed?
    assert(solution.col_value.size() == origColIndex.size());
    assert(solution.row_value.size() == origRowIndex.size());
    // This should be a better measure of whether undo can be
    // performed
    assert(solution.value_valid);
    if (solution.col_value.size() != origColIndex.size()) return;
    if (solution.row_value.size() != origRowIndex.size()) return;

    bool perform_dual_postsolve = solution.dual_valid;
    assert((solution.col_dual.size() == solution.col_value.size()) ==
           perform_dual_postsolve);
    bool perform_basis_postsolve = basis.valid;

    // expand solution to original index space
    undoIterateBackwards(solution.col_value, origColIndex, origNumCol);

    undoIterateBackwards(solution.row_value, origRowIndex, origNumRow);

    if (perform_dual_postsolve) {
      // if dual solution is given, expand dual solution and basis to original
      // index space
      undoIterateBackwards(solution.col_dual, origColIndex, origNumCol);

      undoIterateBackwards(solution.row_dual, origRowIndex, origNumRow);
    }

    if (perform_basis_postsolve) {
      // if basis is given, expand basis status values to original index space
      undoIterateBackwards(basis.col_status, origColIndex, origNumCol);

      undoIterateBackwards(basis.row_status, origRowIndex, origNumRow);
    }

    // now undo the changes
    for (size_t i = reductions.size(); i > numReductions; --i) {
      switch (reductions[i - 1].first) {
        case ReductionType::kLinearTransform: {
          LinearTransform reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution);
          break;
        }
        case ReductionType::kFreeColSubstitution: {
          FreeColSubstitution reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kDoubletonEquation: {
          DoubletonEquation reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAddition: {
          EqualityRowAddition reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAdditions: {
          EqualityRowAdditions reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kSingletonRow: {
          SingletonRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kFixedCol: {
          FixedCol reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kRedundantRow: {
          RedundantRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kForcingRow: {
          ForcingRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumn: {
          ForcingColumn reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumnRemovedRow: {
          ForcingColumnRemovedRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kDuplicateRow: {
          DuplicateRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
        }
        case ReductionType::kSlackColSubstitution: {
          SlackColSubstitution reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
      }
    }
#ifdef DEBUG_EXTRA
    // solution should not contain NaN or Inf
    assert(!containsNanOrInf(solution.col_value));
    // row values are not determined by postsolve
    // assert(!containsNanOrInf(solution.row_value));
    assert(!containsNanOrInf(solution.col_dual));
    assert(!containsNanOrInf(solution.row_dual));
#endif
  }